

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *lhss;
  char *rhss;
  ostream *poVar3;
  cmake *this_00;
  reference ppcVar4;
  cmMakefile *this_01;
  type pcVar5;
  pointer pcVar6;
  bool local_2f1;
  allocator<char> local_291;
  string local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  cmListFileBacktrace local_208;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ostringstream msg;
  string local_30 [32];
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  lhss = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersion_abi_cxx11_();
  rhss = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,rhss);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"The detected version of Ninja (");
    std::operator<<(poVar3,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)local_1b8,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)local_1b8,local_1d8);
    std::operator<<(poVar3,").");
    std::__cxx11::string::~string(local_1d8);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    std::__cxx11::ostringstream::str();
    local_208.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_208.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_208);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8,&local_208);
    cmListFileBacktrace::~cmListFileBacktrace(&local_208);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  else {
    bVar1 = OpenBuildFileStream(this);
    if ((bVar1) && (bVar1 = OpenRulesFileStream(this), bVar1)) {
      std::
      map<const_cmGeneratorTarget_*,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::clear(&this->TargetDependsClosures);
      InitOutputPathPrefix(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"all",&local_249);
      NinjaOutputPath(&local_228,this,&local_248);
      std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"CMakeCache.txt",&local_291);
      NinjaOutputPath(&local_270,this,&local_290);
      std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            LocalGenerators,0);
      this_01 = cmLocalGenerator::GetMakefile(*ppcVar4);
      PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0058,false);
      this->PolicyCMP0058 = PVar2;
      local_2f1 = true;
      if (this->PolicyCMP0058 != OLD) {
        local_2f1 = this->PolicyCMP0058 == WARN;
      }
      this->ComputingUnknownDependencies = local_2f1;
      cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
      WriteAssumedSourceDependencies(this);
      pcVar5 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      WriteTargetAliases(this,(ostream *)pcVar5);
      pcVar5 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      WriteFolderTargets(this,(ostream *)pcVar5);
      pcVar5 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      WriteUnknownExplicitDependencies(this,(ostream *)pcVar5);
      pcVar5 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      WriteBuiltinTargets(this,(ostream *)pcVar5);
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) {
        pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator->(&this->RulesFileStream);
        std::ios::setstate((int)pcVar6 +
                           (int)(pcVar6->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3]);
        pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator->(&this->BuildFileStream);
        std::ios::setstate((int)pcVar6 +
                           (int)(pcVar6->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3]);
      }
      CloseCompileCommandsStream(this);
      CloseRulesFileStream(this);
      CloseBuildFileStream(this);
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << cmGlobalNinjaGenerator::RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return;
  }
  if (!this->OpenBuildFileStream()) {
    return;
  }
  if (!this->OpenRulesFileStream()) {
    return;
  }

  this->TargetDependsClosures.clear();

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteFolderTargets(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    this->BuildFileStream->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}